

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O0

int pri_move(monst *priest)

{
  xchar x;
  xchar y;
  char cVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  boolean local_1e;
  xchar local_1a;
  xchar local_19;
  boolean avoid;
  schar temple;
  xchar omy;
  xchar omx;
  xchar gy;
  xchar gx;
  monst *priest_local;
  
  local_1e = '\x01';
  x = priest->mx;
  y = priest->my;
  bVar2 = histemple_at(priest,x,y);
  if (bVar2 == '\0') {
    priest_local._4_4_ = -1;
  }
  else {
    cVar1 = priest->field_0x75;
    local_19 = priest->field_0x76;
    local_1a = priest->field_0x77;
    iVar3 = rn2(3);
    local_19 = local_19 + (char)iVar3 + -1;
    iVar3 = rn2(3);
    local_1a = local_1a + (char)iVar3 + -1;
    if (((*(uint *)&priest->field_0x60 >> 0x16 & 1) == 0) ||
       (((u.uprops[0x15].intrinsic != 0 || (u.uprops[0x15].extrinsic != 0)) &&
        (iVar3 = resist(priest,'\x04',0,0), iVar3 == 0)))) {
      bVar2 = monnear(priest,(int)u.ux,(int)u.uy);
      if (bVar2 != '\0') {
        if (u.uprops[0x2d].extrinsic != 0) {
          pcVar4 = mon_nam(priest);
          pline("Your displaced image doesn\'t fool %s!",pcVar4);
        }
        mattacku(priest);
        return 0;
      }
      pcVar4 = strchr(u.urooms,(int)cVar1);
      if (pcVar4 != (char *)0x0) {
        if ((((*(uint *)&priest->field_0x60 >> 0x11 & 1) != 0) &&
            ((((u.uprops[0xd].intrinsic == 0 && (u.uprops[0xd].extrinsic == 0)) &&
              ((youmonst.data != mons + 0x9e && (youmonst.data != mons + 0x7b)))) ||
             ((u.uprops[0xd].blocked != 0 || ((priest->data->mflags1 & 0x1000000) != 0)))))) &&
           ((((byte)u._1052_1_ >> 1 & 1) == 0 &&
            (((((byte)u._1052_1_ >> 5 & 1) == 0 && ((*(uint *)&priest->field_0x60 >> 9 & 1) == 0))
             && ((viz_array[priest->my][priest->mx] & 1U) != 0)))))) {
          local_19 = u.ux;
          local_1a = u.uy;
        }
        local_1e = '\0';
      }
    }
    else if ((((u.uprops[0xd].intrinsic != 0) || (u.uprops[0xd].extrinsic != 0)) ||
             ((youmonst.data == mons + 0x9e || (youmonst.data == mons + 0x7b)))) &&
            (u.uprops[0xd].blocked == 0)) {
      local_1e = '\0';
    }
    priest_local._4_4_ = move_special(priest,'\0','\x01','\0',local_1e,x,y,local_19,local_1a);
  }
  return priest_local._4_4_;
}

Assistant:

int pri_move(struct monst *priest)
{
	xchar gx,gy,omx,omy;
	schar temple;
	boolean avoid = TRUE;

	omx = priest->mx;
	omy = priest->my;

	if (!histemple_at(priest, omx, omy)) return -1;

	temple = EPRI(priest)->shroom;

	gx = EPRI(priest)->shrpos.x;
	gy = EPRI(priest)->shrpos.y;

	gx += rn1(3,-1);	/* mill around the altar */
	gy += rn1(3,-1);

	if (!priest->mpeaceful ||
	   (Conflict && !resist(priest, RING_CLASS, 0, 0))) {
		if (monnear(priest, u.ux, u.uy)) {
			if (Displaced)
				pline("Your displaced image doesn't fool %s!",
					mon_nam(priest));
			mattacku(priest);
			return 0;
		} else if (strchr(u.urooms, temple)) {
			/* chase player if inside temple & can see him */
			if (priest->mcansee && m_canseeu(priest)) {
				gx = u.ux;
				gy = u.uy;
			}
			avoid = FALSE;
		}
	} else if (Invis) avoid = FALSE;

	return move_special(priest,FALSE,TRUE,FALSE,avoid,omx,omy,gx,gy);
}